

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_short_writes.c
# Opt level: O0

ssize_t short_write_callback(archive *a,void *client_data,void *buffer,size_t length)

{
  size_t __size;
  void *pvVar1;
  size_t local_50;
  char *new_buf;
  size_t new_len;
  size_t to_write;
  checker *checker;
  size_t length_local;
  void *buffer_local;
  void *client_data_local;
  archive *a_local;
  
  local_50 = length;
  if (99 < length) {
    local_50 = 100;
  }
  __size = *(long *)((long)client_data + 0x10) + local_50;
  pvVar1 = realloc(*(void **)((long)client_data + 8),__size);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L':',(uint)(pvVar1 != (void *)0x0),"new_buf != NULL",(void *)0x0);
  *(void **)((long)client_data + 8) = pvVar1;
  memcpy((void *)(*(long *)((long)client_data + 8) + *(long *)((long)client_data + 0x10)),buffer,
         local_50);
  *(size_t *)((long)client_data + 0x10) = __size;
  return local_50;
}

Assistant:

static ssize_t
short_write_callback(struct archive *a, void *client_data, const void *buffer, size_t length)
{
        (void)a;

        struct checker *checker = client_data;
        size_t to_write = length < 100 ? length : 100;
        size_t new_len = checker->shortbuf_len + to_write;
        char *new_buf = realloc(checker->shortbuf, new_len);
        assert(new_buf != NULL);

        checker->shortbuf = new_buf;
        memcpy(checker->shortbuf + checker->shortbuf_len, buffer, to_write);
        checker->shortbuf_len = new_len;

        return to_write;
}